

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.h
# Opt level: O0

void __thiscall Js::AsmJsModuleInfo::AsmJsModuleInfo(AsmJsModuleInfo *this,Recycler *recycler)

{
  nullptr_t local_40;
  nullptr_t local_38;
  nullptr_t local_30;
  nullptr_t local_28;
  nullptr_t local_20;
  Recycler *local_18;
  Recycler *recycler_local;
  AsmJsModuleInfo *this_local;
  
  this->mRecycler = recycler;
  this->mArgInCount = 0;
  this->mVarCount = 0;
  this->mVarImportCount = 0;
  this->mFunctionImportCount = 0;
  this->mFunctionCount = 0;
  this->mFunctionTableCount = 0;
  local_18 = recycler;
  recycler_local = (Recycler *)this;
  Memory::WriteBarrierPtr<Js::PropertyIdArray>::WriteBarrierPtr(&this->mExports);
  Memory::WriteBarrierPtr<unsigned_int>::WriteBarrierPtr(&this->mExportsFunctionLocation);
  local_20 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::AsmJsModuleInfo::ModuleVar>::WriteBarrierPtr(&this->mVars,&local_20);
  local_28 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::AsmJsModuleInfo::ModuleVarImport>::WriteBarrierPtr
            (&this->mVarImports,&local_28);
  local_30 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::AsmJsModuleInfo::ModuleFunctionImport>::WriteBarrierPtr
            (&this->mFunctionImports,&local_30);
  local_38 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::AsmJsModuleInfo::ModuleFunction>::WriteBarrierPtr
            (&this->mFunctions,&local_38);
  Memory::WriteBarrierPtr<Js::AsmJsModuleInfo::ModuleFunctionTable>::WriteBarrierPtr
            (&this->mFunctionTables);
  local_40 = (nullptr_t)0x0;
  Memory::
  WriteBarrierPtr<JsUtil::BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::WriteBarrierPtr(&this->mSlotMap,&local_40);
  BVStatic<32UL>::BVStatic(&this->mAsmMathBuiltinUsed);
  BVStatic<16UL>::BVStatic(&this->mAsmArrayBuiltinUsed);
  this->mMaxHeapAccess = 0;
  this->mIsProcessed = false;
  return;
}

Assistant:

AsmJsModuleInfo( Recycler* recycler ) :
            mRecycler( recycler )
            , mArgInCount( 0 )
            , mVarCount( 0 )
            , mVarImportCount( 0 )
            , mFunctionImportCount( 0 )
            , mFunctionCount( 0 )
            , mFunctionTableCount( 0 )

            , mVars( nullptr )
            , mVarImports( nullptr )
            , mFunctionImports( nullptr )
            , mFunctions( nullptr )
            , mMaxHeapAccess(0)
            , mIsProcessed(false)
            , mSlotMap(nullptr)
        {

        }